

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::Print(TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
        *this,char *name,ostream *out,MatrixOutputFormat form)

{
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Frontal Matrix associated",0x19);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  TPZFrontSym<std::complex<double>_>::Print(&this->fFront,name,out);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Stored Equations",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  TPZStackEqnStorage<std::complex<double>_>::Print(&this->fStorage,name,out);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Number of Equations ",0x14);
  poVar2 = std::ostream::_M_insert<long>((long)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Number of Elements connected to DF",0x22);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if (0 < (this->fNumElConnected).fNElements) {
    lVar4 = 0;
    do {
      poVar2 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      plVar3 = (long *)std::ostream::operator<<(poVar2,(this->fNumElConnected).fStore[lVar4]);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->fNumElConnected).fNElements);
  }
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const
{
	int64_t i;
	out << "Frontal Matrix associated"<< endl;
	fFront.Print(name, out);
	out << "Stored Equations" << endl;
	fStorage.Print(name, out);
	out << "Number of Equations " << fNumEq << endl;
	out << "Number of Elements connected to DF" << endl;
	for(i=0;i<fNumElConnected.NElements();i++){
		out << i << " " << fNumElConnected[i] << endl;
	}
}